

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# embed.cpp
# Opt level: O1

int __thiscall ncnn::Embed::forward(Embed *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  void *pvVar1;
  size_t sVar2;
  void *pvVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  uint _h;
  ulong uVar7;
  int iVar8;
  long lVar9;
  
  _h = bottom_blob->c * (int)bottom_blob->cstep;
  Mat::create(top_blob,this->num_output,_h,4,opt->blob_allocator);
  iVar4 = -100;
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    if (0 < (int)_h) {
      uVar7 = 0;
      do {
        pvVar1 = top_blob->data;
        sVar2 = top_blob->elemsize;
        iVar4 = top_blob->w;
        iVar5 = *(int *)((long)bottom_blob->data + uVar7 * 4);
        if (iVar5 < 1) {
          iVar5 = 0;
        }
        iVar8 = this->input_dim + -1;
        if (iVar5 < this->input_dim) {
          iVar8 = iVar5;
        }
        memcpy((void *)(uVar7 * (long)iVar4 * sVar2 + (long)pvVar1),
               (void *)((long)iVar8 * (long)this->num_output * 4 + (long)(this->weight_data).data),
               (long)this->num_output << 2);
        if ((this->bias_term != 0) && (iVar5 = this->num_output, 0 < (long)iVar5)) {
          pvVar3 = (this->bias_data).data;
          lVar9 = sVar2 * uVar7 * (long)iVar4;
          lVar6 = 0;
          do {
            *(float *)((long)pvVar1 + lVar6 * 4 + lVar9) =
                 *(float *)((long)pvVar1 + lVar6 * 4 + lVar9) + *(float *)((long)pvVar3 + lVar6 * 4)
            ;
            lVar6 = lVar6 + 1;
          } while (iVar5 != lVar6);
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 != _h);
    }
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int Embed::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int words = static_cast<int>(bottom_blob.total());

    top_blob.create(num_output, words, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < words; q++)
    {
        float* outptr = top_blob.row(q);

        int word_index = ((const int*)bottom_blob)[q];

        if (word_index < 0)
            word_index = 0;
        if (word_index >= input_dim)
            word_index = input_dim - 1;

        const float* em = (const float*)weight_data + num_output * word_index;

        memcpy(outptr, em, num_output * sizeof(float));

        if (bias_term)
        {
            for (int p = 0; p < num_output; p++)
            {
                outptr[p] += bias_data[p];
            }
        }
    }

    return 0;
}